

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

int __thiscall Analyser::getFunctionIndex(Analyser *this,string *s)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  string *psVar4;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->_functions)._M_t,s);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_functions)._M_t._M_impl.super__Rb_tree_header) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->_functions,s);
    return *pmVar3;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"function is not exist","");
  iVar1 = this->_currentLine;
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_40,local_40 + local_38);
  *(long *)(psVar4 + 0x20) = (long)iVar1;
  __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

int Analyser::getFunctionIndex(const std::string& s)
{
	if (_functions.find(s) != _functions.end()) {
		return _functions[s];
	}
	throw Error("function is not exist", _currentLine);
}